

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_free.c
# Opt level: O1

void lysp_include_free_(lysf_ctx *ctx,lysp_include *include,ly_bool main_module)

{
  lysp_ext_instance *plVar1;
  lysp_ext_instance *plVar2;
  undefined3 in_register_00000011;
  lysp_ext_instance *plVar3;
  long lVar4;
  
  if ((CONCAT31(in_register_00000011,main_module) != 0) &&
     (include->submodule != (lysp_submodule *)0x0)) {
    lysp_module_free(ctx,(lysp_module *)include->submodule);
  }
  lydict_remove(ctx->ctx,include->name);
  lydict_remove(ctx->ctx,include->dsc);
  lydict_remove(ctx->ctx,include->ref);
  lVar4 = 0;
  plVar3 = (lysp_ext_instance *)0x0;
  while( true ) {
    plVar1 = include->exts;
    if (plVar1 == (lysp_ext_instance *)0x0) {
      plVar2 = (lysp_ext_instance *)0x0;
    }
    else {
      plVar2 = plVar1[-1].exts;
    }
    if (plVar2 <= plVar3) break;
    lysp_ext_instance_free(ctx,(lysp_ext_instance *)((long)&plVar1->name + lVar4));
    plVar3 = (lysp_ext_instance *)((long)&plVar3->name + 1);
    lVar4 = lVar4 + 0x70;
  }
  if (plVar1 != (lysp_ext_instance *)0x0) {
    free(&plVar1[-1].exts);
    return;
  }
  return;
}

Assistant:

static void
lysp_include_free_(struct lysf_ctx *ctx, struct lysp_include *include, ly_bool main_module)
{
    if (main_module && include->submodule) {
        lysp_module_free(ctx, (struct lysp_module *)include->submodule);
    }
    lydict_remove(ctx->ctx, include->name);
    lydict_remove(ctx->ctx, include->dsc);
    lydict_remove(ctx->ctx, include->ref);
    FREE_ARRAY(ctx, include->exts, lysp_ext_instance_free);
}